

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

bool __thiscall
spvtools::val::anon_unknown_2::IsAllowedTypeOrArrayOfSame
          (anon_unknown_2 *this,ValidationState_t *_,Instruction *type,
          initializer_list<spv::Op> allowed)

{
  Op *pOVar1;
  undefined4 in_EAX;
  Op *pOVar2;
  Instruction *pIVar3;
  bool bVar4;
  undefined8 local_28;
  
  pOVar1 = (Op *)((long)&(type->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)allowed._M_array * 4);
  local_28 = (ulong)CONCAT24(*(undefined2 *)
                              ((long)&(_->unresolved_forward_ids_)._M_h._M_buckets + 2),in_EAX);
  pOVar2 = std::__find_if<spv::Op_const*,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                     (type,pOVar1,(long)&local_28 + 4,allowed._M_array,allowed._M_len);
  bVar4 = true;
  if (pOVar2 == pOVar1) {
    if (((ulong)(_->unresolved_forward_ids_)._M_h._M_buckets & 0xfffe0000) == 0x1c0000) {
      pIVar3 = ValidationState_t::FindDef
                         ((ValidationState_t *)this,*(uint32_t *)&_->context_->opcode_table);
      local_28 = CONCAT44(local_28._4_4_,(uint)(pIVar3->inst_).opcode);
      pOVar2 = std::__find_if<spv::Op_const*,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                         (type,pOVar1);
      bVar4 = pOVar2 != pOVar1;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool IsAllowedTypeOrArrayOfSame(ValidationState_t& _, const Instruction* type,
                                std::initializer_list<spv::Op> allowed) {
  if (std::find(allowed.begin(), allowed.end(), type->opcode()) !=
      allowed.end()) {
    return true;
  }
  if (type->opcode() == spv::Op::OpTypeArray ||
      type->opcode() == spv::Op::OpTypeRuntimeArray) {
    auto elem_type = _.FindDef(type->word(2));
    return std::find(allowed.begin(), allowed.end(), elem_type->opcode()) !=
           allowed.end();
  }
  return false;
}